

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<unsigned_long>::set_size
          (RepeatedField<unsigned_long> *this,bool is_soo,int size)

{
  int iVar1;
  Nonnull<const_char_*> pcVar2;
  undefined7 in_register_00000031;
  
  iVar1 = 1;
  if ((int)CONCAT71(in_register_00000031,is_soo) == 0) {
    iVar1 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (iVar1 < size) {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((long)size,(long)iVar1,"size <= Capacity(is_soo)");
  }
  else {
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar2 == (Nonnull<const_char_*>)0x0) {
    internal::SooRep::set_size(&this->soo_rep_,is_soo,size);
    return;
  }
  set_size();
}

Assistant:

void set_size(bool is_soo, int size) {
    ABSL_DCHECK_LE(size, Capacity(is_soo));
    soo_rep_.set_size(is_soo, size);
  }